

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3CursorSeek(sqlite3_context *pContext,Fts3Cursor *pCsr)

{
  int iVar1;
  Fts3Cursor *in_RSI;
  sqlite3_stmt *in_RDI;
  Fts3Table *pTab;
  sqlite3_stmt *in_stack_00000008;
  int rc;
  undefined8 in_stack_ffffffffffffffd8;
  sqlite3_vtab *psVar2;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  local_4 = 0;
  if ((in_RSI->isRequireSeek != '\0') && (local_4 = fts3CursorSeekStmt(in_RSI), local_4 == 0)) {
    psVar2 = (in_RSI->base).pVtab;
    psVar2[4].nRef = psVar2[4].nRef + 1;
    sqlite3_bind_int64(in_RDI,(int)((ulong)in_RSI >> 0x20),(ulong)in_stack_ffffffffffffffe0);
    in_RSI->isRequireSeek = '\0';
    iVar1 = sqlite3_step(in_stack_00000008);
    if (iVar1 == 100) {
      psVar2[4].nRef = psVar2[4].nRef + -1;
      return 0;
    }
    psVar2[4].nRef = psVar2[4].nRef + -1;
    local_4 = sqlite3_reset(in_RDI);
    iVar1 = (int)((ulong)psVar2 >> 0x20);
    if ((local_4 == 0) && (*(long *)&(in_RSI->base).pVtab[3].nRef == 0)) {
      local_4 = 0x10b;
      in_RSI->isEof = '\x01';
    }
  }
  if ((local_4 != 0) && (in_RDI != (sqlite3_stmt *)0x0)) {
    sqlite3_result_error_code((sqlite3_context *)CONCAT44(local_4,in_stack_ffffffffffffffe0),iVar1);
  }
  return local_4;
}

Assistant:

static int fts3CursorSeek(sqlite3_context *pContext, Fts3Cursor *pCsr){
  int rc = SQLITE_OK;
  if( pCsr->isRequireSeek ){
    rc = fts3CursorSeekStmt(pCsr);
    if( rc==SQLITE_OK ){
      Fts3Table *pTab = (Fts3Table*)pCsr->base.pVtab;
      pTab->bLock++;
      sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iPrevId);
      pCsr->isRequireSeek = 0;
      if( SQLITE_ROW==sqlite3_step(pCsr->pStmt) ){
        pTab->bLock--;
        return SQLITE_OK;
      }else{
        pTab->bLock--;
        rc = sqlite3_reset(pCsr->pStmt);
        if( rc==SQLITE_OK && ((Fts3Table *)pCsr->base.pVtab)->zContentTbl==0 ){
          /* If no row was found and no error has occurred, then the %_content
          ** table is missing a row that is present in the full-text index.
          ** The data structures are corrupt.  */
          rc = FTS_CORRUPT_VTAB;
          pCsr->isEof = 1;
        }
      }
    }
  }

  if( rc!=SQLITE_OK && pContext ){
    sqlite3_result_error_code(pContext, rc);
  }
  return rc;
}